

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::reset_old_trail(Solver *this)

{
  Lit *pLVar1;
  uint *puVar2;
  int i;
  long lVar3;
  
  pLVar1 = (this->old_trail).data;
  puVar2 = (this->oldreasons).data;
  for (lVar3 = 0; lVar3 < (this->old_trail).sz; lVar3 = lVar3 + 1) {
    puVar2[pLVar1[lVar3].x >> 1] = 0xffffffff;
  }
  if (pLVar1 != (Lit *)0x0) {
    (this->old_trail).sz = 0;
  }
  this->old_trail_qhead = 0;
  return;
}

Assistant:

void Solver::reset_old_trail()
{
    TRACE(std::cout << "c reset old trail" << std::endl);
    for (int i = 0; i < old_trail.size(); i++) {
        oldreasons[var(old_trail[i])] = CRef_Undef;
    }
    old_trail.clear();
    old_trail_qhead = 0;
}